

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  ulong *puVar1;
  size_type *psVar2;
  pointer pcVar3;
  char *pcVar4;
  cmMakefile *this_00;
  int iVar5;
  iterator iVar6;
  undefined8 *puVar7;
  char *pcVar8;
  mapped_type_conflict *pmVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  string *psVar12;
  mapped_type *pmVar13;
  pointer pbVar14;
  pointer pbVar15;
  undefined8 uVar16;
  ulong uVar17;
  string *i;
  key_type *__k;
  string ignoreExtensionsVar;
  string ignoreExts;
  int preference;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string outputExtensionVar;
  string linkerPrefVar;
  key_type local_120;
  string local_100;
  int local_dc;
  undefined1 local_d8 [32];
  string local_b8;
  pointer *local_98;
  long local_90;
  pointer local_88 [2];
  cmMakefile *local_78;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LanguageToLinkerPreference)._M_t,l);
  if ((_Rb_tree_header *)iVar6._M_node !=
      &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"CMAKE_","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar3 = (l->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar3,pcVar3 + l->_M_string_length);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    uVar16 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_100._M_string_length + local_120._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar16 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_100._M_string_length + local_120._M_string_length) goto LAB_00320b67;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_100,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
  }
  else {
LAB_00320b67:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  puVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_b8.field_2._M_allocated_capacity = *puVar1;
    local_b8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar1;
    local_b8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b8._M_string_length = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"_LINKER_PREFERENCE","");
  pbVar14 = (pointer)((long)&((_Alloc_hider *)local_d8._8_8_)->_M_p + local_b8._M_string_length);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar16 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < pbVar14) {
    pbVar15 = (pointer)0xf;
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
      pbVar15 = (pointer)local_d8._16_8_;
    }
    if (pbVar15 < pbVar14) goto LAB_00320c3d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_d8,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_00320c3d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,local_d8._0_8_);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar2 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_70.field_2._M_allocated_capacity = *psVar2;
    local_70.field_2._8_8_ = puVar7[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar2;
    local_70._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_70._M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pcVar8 = cmMakefile::GetDefinition(mf,&local_70);
  local_dc = 0;
  if (pcVar8 == (char *)0x0) {
LAB_00320e07:
    local_dc = 0;
  }
  else {
    iVar5 = __isoc99_sscanf(pcVar8,"%d",&local_dc);
    if (iVar5 == 1) {
      if (local_dc < 0) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_b8);
        cmSystemTools::Message(&local_b8,"Warning");
        local_dc = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00320e07;
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (*pcVar8 != 'P') goto LAB_00320e07;
      local_dc = 100;
    }
  }
  iVar5 = local_dc;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->LanguageToLinkerPreference,l);
  *pmVar9 = iVar5;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"CMAKE_","");
  local_d8._0_8_ = local_d8 + 0x10;
  pcVar3 = (l->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)local_d8,pcVar3,pcVar3 + l->_M_string_length);
  pbVar14 = (pointer)((long)&((_Alloc_hider *)local_d8._8_8_)->_M_p + local_100._M_string_length);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    uVar16 = local_100.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < pbVar14) {
    pbVar15 = (pointer)0xf;
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
      pbVar15 = (pointer)local_d8._16_8_;
    }
    if (pbVar15 < pbVar14) goto LAB_00320e9c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_d8,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
  }
  else {
LAB_00320e9c:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,local_d8._0_8_);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  puVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_120.field_2._M_allocated_capacity = *puVar1;
    local_120.field_2._8_8_ = puVar7[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar1;
    local_120._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_120._M_string_length = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_OUTPUT_EXTENSION","");
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    uVar16 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < (pointer)(local_90 + local_120._M_string_length)) {
    pbVar14 = (pointer)0xf;
    if (local_98 != local_88) {
      pbVar14 = local_88[0];
    }
    if (pbVar14 < (pointer)(local_90 + local_120._M_string_length)) goto LAB_00320f74;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
  }
  else {
LAB_00320f74:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_98);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar2 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_b8.field_2._M_allocated_capacity = *psVar2;
    local_b8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar2;
    local_b8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b8._M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88[0]->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pcVar8 = cmMakefile::GetDefinition(mf,&local_b8);
  local_78 = mf;
  if (pcVar8 != (char *)0x0) {
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->LanguageToOutputExtension,l);
    pcVar4 = (char *)pmVar10->_M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar4,(ulong)pcVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    sVar11 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,pcVar8,pcVar8 + sVar11);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->OutputExtensions,&local_120);
    pcVar4 = (char *)pmVar10->_M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar4,(ulong)pcVar8);
    mf = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (*pcVar8 == '.') {
      pcVar4 = pcVar8 + 1;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      sVar11 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,pcVar4,pcVar8 + sVar11 + 1);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->OutputExtensions,&local_120);
      pcVar8 = (char *)pmVar10->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar8,(ulong)pcVar4);
      mf = local_78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        mf = local_78;
      }
    }
  }
  FillExtensionToLanguageMap(this,l,mf);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
  pcVar3 = (l->_M_dataplus)._M_p;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar3,pcVar3 + l->_M_string_length)
  ;
  pbVar14 = (pointer)((long)&((_Alloc_hider *)local_d8._8_8_)->_M_p + local_90);
  pbVar15 = (pointer)0xf;
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    pbVar15 = (pointer)local_d8._16_8_;
  }
  if (pbVar15 < pbVar14) {
    pbVar15 = (pointer)0xf;
    if (local_98 != local_88) {
      pbVar15 = local_88[0];
    }
    if (pbVar15 < pbVar14) goto LAB_00321245;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,local_d8._0_8_);
  }
  else {
LAB_00321245:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append(local_d8,(ulong)local_98);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  puVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_100.field_2._M_allocated_capacity = *puVar1;
    local_100.field_2._8_4_ = *(undefined4 *)(puVar7 + 3);
    local_100.field_2._12_4_ = *(undefined4 *)((long)puVar7 + 0x1c);
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar1;
    local_100._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_100._M_string_length = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_IGNORE_EXTENSIONS","");
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    uVar16 = local_100.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_48 + local_100._M_string_length) {
    uVar17 = 0xf;
    if (local_50 != local_40) {
      uVar17 = local_40[0];
    }
    if (local_48 + local_100._M_string_length <= uVar17) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      goto LAB_0032133c;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_50);
LAB_0032133c:
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  psVar2 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_120.field_2._M_allocated_capacity = *psVar2;
    local_120.field_2._8_8_ = puVar7[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar2;
    local_120._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_120._M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  this_00 = local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88[0]->_M_dataplus)._M_p + 1));
  }
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  psVar12 = cmMakefile::GetSafeDefinition(this_00,&local_120);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar3,pcVar3 + psVar12->_M_string_length);
  local_d8._0_8_ = (key_type *)0x0;
  local_d8._8_8_ = (key_type *)0x0;
  local_d8._16_8_ = (pointer)0x0;
  cmSystemTools::ExpandListArgument
            (&local_100,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8,false);
  uVar16 = local_d8._8_8_;
  if (local_d8._0_8_ != local_d8._8_8_) {
    __k = (key_type *)local_d8._0_8_;
    do {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::operator[](&this->IgnoreExtensions,__k);
      *pmVar13 = true;
      __k = __k + 1;
    } while (__k != (key_type *)uVar16);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (this->LanguageToLinkerPreference.find(l) !=
      this->LanguageToLinkerPreference.end()) {
    return;
  }

  std::string linkerPrefVar =
    std::string("CMAKE_") + std::string(l) + std::string("_LINKER_PREFERENCE");
  const char* linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (linkerPref) {
    if (sscanf(linkerPref, "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if (linkerPref[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg = linkerPrefVar;
    msg += " is negative, adjusting it to 0";
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar =
    std::string("CMAKE_") + std::string(l) + std::string("_OUTPUT_EXTENSION");
  const char* outputExtension = mf->GetDefinition(outputExtensionVar);
  if (outputExtension) {
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (outputExtension[0] == '.') {
      this->OutputExtensions[outputExtension + 1] = outputExtension + 1;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    std::string("CMAKE_") + std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(ignoreExts, extensionList);
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}